

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O0

void BinaryCache::PutBytecode(char *path,char *bytecode,Lexeme *lexStart,uint lexCount)

{
  uint uVar1;
  uint uVar2;
  CodeDescriptor *pCVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  Lexeme *pLVar7;
  uint pathLen;
  CodeDescriptor *desc;
  uint i;
  uint hash;
  uint lexCount_local;
  Lexeme *lexStart_local;
  char *bytecode_local;
  char *path_local;
  
  uVar1 = NULLC::GetStringHash(path);
  if (uVar1 != lastHash) {
    desc._4_4_ = 0;
    while ((uVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::size
                              ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache),
           desc._4_4_ < uVar2 &&
           (pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                               ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,
                                desc._4_4_), uVar1 != pCVar3->nameHash))) {
      desc._4_4_ = desc._4_4_ + 1;
    }
    uVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::size
                      ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache);
    if (desc._4_4_ != uVar2) {
      __assert_fail("i == cache.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                    ,0x69,
                    "void BinaryCache::PutBytecode(const char *, const char *, Lexeme *, unsigned int)"
                   );
    }
    pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::push_back
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache);
    sVar4 = strlen(path);
    pcVar5 = (char *)(*(code *)NULLC::alloc)((int)sVar4 + 1);
    pcVar5 = strcpy(pcVar5,path);
    pCVar3->name = pcVar5;
    pCVar3->nameHash = uVar1;
    pCVar3->binary = bytecode;
    if (lexStart == (Lexeme *)0x0) {
      pCVar3->lexemes = (Lexeme *)0x0;
      pCVar3->lexemeCount = 0;
    }
    else {
      uVar6 = SUB168(ZEXT416(lexCount) * ZEXT816(0x20),0);
      if (SUB168(ZEXT416(lexCount) * ZEXT816(0x20),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pLVar7 = (Lexeme *)operator_new__(uVar6);
      pCVar3->lexemes = pLVar7;
      memcpy(pCVar3->lexemes,lexStart,(ulong)lexCount << 5);
      pCVar3->lexemeCount = lexCount;
    }
  }
  return;
}

Assistant:

void BinaryCache::PutBytecode(const char* path, const char* bytecode, Lexeme* lexStart, unsigned lexCount)
{
	unsigned int hash = NULLC::GetStringHash(path);

	if(hash == lastHash)
		return;

	unsigned int i = 0;
	for(; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
			break;
	}
	assert(i == cache.size());

	BinaryCache::CodeDescriptor *desc = cache.push_back();
	unsigned int pathLen = (unsigned int)strlen(path);
	desc->name = strcpy((char*)NULLC::alloc(pathLen + 1), path);
	desc->nameHash = hash;
	desc->binary = bytecode;
	if(lexStart)
	{
		desc->lexemes = new Lexeme[lexCount];
		memcpy(desc->lexemes, lexStart, lexCount * sizeof(Lexeme));
		desc->lexemeCount = lexCount;
	}else{
		desc->lexemes = NULL;
		desc->lexemeCount = 0;
	}
}